

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O0

void SplitRGBRow_SSSE3(uint8_t *src_rgb,uint8_t *dst_r,uint8_t *dst_g,uint8_t *dst_b,int width)

{
  bool bVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int width_local;
  uint8_t *dst_b_local;
  uint8_t *dst_g_local;
  uint8_t *dst_r_local;
  uint8_t *src_rgb_local;
  
  do {
    auVar3 = pshufb(*(undefined1 (*) [16])src_rgb,(undefined1  [16])libyuv::kShuffleMaskRGBToR0);
    auVar4 = pshufb(*(undefined1 (*) [16])((long)src_rgb + 0x10),
                    (undefined1  [16])libyuv::kShuffleMaskRGBToR1);
    auVar5 = pshufb(*(undefined1 (*) [16])((long)src_rgb + 0x20),
                    (undefined1  [16])libyuv::kShuffleMaskRGBToR2);
    *(undefined1 (*) [16])dst_r = auVar3 | auVar4 | auVar5;
    dst_r = (uint8_t *)((long)dst_r + 0x10);
    auVar3 = pshufb(*(undefined1 (*) [16])src_rgb,(undefined1  [16])libyuv::kShuffleMaskRGBToG0);
    auVar4 = pshufb(*(undefined1 (*) [16])((long)src_rgb + 0x10),
                    (undefined1  [16])libyuv::kShuffleMaskRGBToG1);
    auVar5 = pshufb(*(undefined1 (*) [16])((long)src_rgb + 0x20),
                    (undefined1  [16])libyuv::kShuffleMaskRGBToG2);
    *(undefined1 (*) [16])dst_g = auVar3 | auVar4 | auVar5;
    dst_g = (uint8_t *)((long)dst_g + 0x10);
    auVar3 = pshufb(*(undefined1 (*) [16])src_rgb,(undefined1  [16])libyuv::kShuffleMaskRGBToB0);
    auVar4 = pshufb(*(undefined1 (*) [16])((long)src_rgb + 0x10),
                    (undefined1  [16])libyuv::kShuffleMaskRGBToB1);
    auVar5 = pshufb(*(undefined1 (*) [16])((long)src_rgb + 0x20),
                    (undefined1  [16])libyuv::kShuffleMaskRGBToB2);
    *(undefined1 (*) [16])dst_b = auVar3 | auVar4 | auVar5;
    dst_b = (uint8_t *)((long)dst_b + 0x10);
    src_rgb = (uint8_t *)((long)src_rgb + 0x30);
    iVar2 = width + -0x10;
    bVar1 = 0xf < width;
    width = iVar2;
  } while (iVar2 != 0 && bVar1);
  return;
}

Assistant:

void SplitRGBRow_SSSE3(const uint8_t* src_rgb,
                       uint8_t* dst_r,
                       uint8_t* dst_g,
                       uint8_t* dst_b,
                       int width) {
  asm volatile(

      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "movdqu      0x10(%0),%%xmm1               \n"
      "movdqu      0x20(%0),%%xmm2               \n"
      "pshufb      %5, %%xmm0                    \n"
      "pshufb      %6, %%xmm1                    \n"
      "pshufb      %7, %%xmm2                    \n"
      "por         %%xmm1,%%xmm0                 \n"
      "por         %%xmm2,%%xmm0                 \n"
      "movdqu      %%xmm0,(%1)                   \n"
      "lea         0x10(%1),%1                   \n"

      "movdqu      (%0),%%xmm0                   \n"
      "movdqu      0x10(%0),%%xmm1               \n"
      "movdqu      0x20(%0),%%xmm2               \n"
      "pshufb      %8, %%xmm0                    \n"
      "pshufb      %9, %%xmm1                    \n"
      "pshufb      %10, %%xmm2                   \n"
      "por         %%xmm1,%%xmm0                 \n"
      "por         %%xmm2,%%xmm0                 \n"
      "movdqu      %%xmm0,(%2)                   \n"
      "lea         0x10(%2),%2                   \n"

      "movdqu      (%0),%%xmm0                   \n"
      "movdqu      0x10(%0),%%xmm1               \n"
      "movdqu      0x20(%0),%%xmm2               \n"
      "pshufb      %11, %%xmm0                   \n"
      "pshufb      %12, %%xmm1                   \n"
      "pshufb      %13, %%xmm2                   \n"
      "por         %%xmm1,%%xmm0                 \n"
      "por         %%xmm2,%%xmm0                 \n"
      "movdqu      %%xmm0,(%3)                   \n"
      "lea         0x10(%3),%3                   \n"
      "lea         0x30(%0),%0                   \n"
      "sub         $0x10,%4                      \n"
      "jg          1b                            \n"
      : "+r"(src_rgb),             // %0
        "+r"(dst_r),               // %1
        "+r"(dst_g),               // %2
        "+r"(dst_b),               // %3
        "+r"(width)                // %4
      : "m"(kShuffleMaskRGBToR0),  // %5
        "m"(kShuffleMaskRGBToR1),  // %6
        "m"(kShuffleMaskRGBToR2),  // %7
        "m"(kShuffleMaskRGBToG0),  // %8
        "m"(kShuffleMaskRGBToG1),  // %9
        "m"(kShuffleMaskRGBToG2),  // %10
        "m"(kShuffleMaskRGBToB0),  // %11
        "m"(kShuffleMaskRGBToB1),  // %12
        "m"(kShuffleMaskRGBToB2)   // %13
      : "memory", "cc", "xmm0", "xmm1", "xmm2");
}